

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O0

void __thiscall
vkt::
InstanceFactory1<vkt::wsi::(anonymous_namespace)::DisplayTimingTestInstance,_vkt::wsi::(anonymous_namespace)::TestConfig,_vkt::wsi::(anonymous_namespace)::Programs>
::initPrograms(InstanceFactory1<vkt::wsi::(anonymous_namespace)::DisplayTimingTestInstance,_vkt::wsi::(anonymous_namespace)::TestConfig,_vkt::wsi::(anonymous_namespace)::Programs>
               *this,SourceCollections *dst)

{
  SourceCollections *dst_local;
  InstanceFactory1<vkt::wsi::(anonymous_namespace)::DisplayTimingTestInstance,_vkt::wsi::(anonymous_namespace)::TestConfig,_vkt::wsi::(anonymous_namespace)::Programs>
  *this_local;
  
  wsi::anon_unknown_0::Programs::init((EVP_PKEY_CTX *)dst);
  return;
}

Assistant:

void			initPrograms		(vk::SourceCollections& dst) const { m_progs.init(dst, m_arg0); }